

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScapeGoatTree.cpp
# Opt level: O3

void __thiscall ScapeGoatTree::rebuild(ScapeGoatTree *this,Node *node)

{
  Node *pNVar1;
  uint ns;
  Node **a;
  Node *pNVar2;
  ulong uVar3;
  Node *pNVar4;
  
  ns = size(this,node);
  pNVar4 = node->parent;
  uVar3 = 0xffffffffffffffff;
  if (-1 < (int)ns) {
    uVar3 = (ulong)ns << 3;
  }
  a = (Node **)operator_new__(uVar3);
  packIntoArray(this,node,a,0);
  if (pNVar4 == (Node *)0x0) {
    pNVar4 = (Node *)0x0;
    pNVar2 = buildBalanced(this,a,0,ns);
    this->root = pNVar2;
  }
  else {
    pNVar1 = pNVar4->rightChild;
    pNVar2 = buildBalanced(this,a,0,ns);
    if (pNVar1 == node) {
      pNVar4->rightChild = pNVar2;
    }
    else {
      pNVar4->leftChild = pNVar2;
    }
  }
  pNVar2->parent = pNVar4;
  return;
}

Assistant:

void ScapeGoatTree::rebuild(Node *node) {
    int ns = size(node);
    Node *p = node->parent;
    auto **a = new Node *[ns];
    packIntoArray(node, a, 0);
    if (p == nullptr) {
        root = buildBalanced(a, 0, ns);
        root->parent = nullptr;
    } else if (p->rightChild == node) {
        p->rightChild = buildBalanced(a, 0, ns);
        p->rightChild->parent = p;
    } else {
        p->leftChild = buildBalanced(a, 0, ns);
        p->leftChild->parent = p;
    }
}